

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * flatten_trivial_operations(Query *q,bool *changed)

{
  QueryType *pQVar1;
  vector<Query,_std::allocator<Query>_> *pvVar2;
  size_type sVar3;
  undefined1 *in_RDX;
  Query *in_RSI;
  Query *in_RDI;
  Query *this;
  
  this = in_RDI;
  pQVar1 = Query::get_type(in_RSI);
  if (*pQVar1 == AND) {
    pvVar2 = Query::as_queries(in_RSI);
    sVar3 = std::vector<Query,_std::allocator<Query>_>::size(pvVar2);
    if (sVar3 == 1) {
      *in_RDX = 1;
      pvVar2 = Query::as_queries(in_RSI);
      std::vector<Query,_std::allocator<Query>_>::operator[](pvVar2,0);
      Query::Query(this,in_RDI);
      return this;
    }
  }
  pQVar1 = Query::get_type(in_RSI);
  if (*pQVar1 == OR) {
    pvVar2 = Query::as_queries(in_RSI);
    sVar3 = std::vector<Query,_std::allocator<Query>_>::size(pvVar2);
    if (sVar3 == 1) {
      *in_RDX = 1;
      pvVar2 = Query::as_queries(in_RSI);
      std::vector<Query,_std::allocator<Query>_>::operator[](pvVar2,0);
      Query::Query(this,in_RDI);
      return this;
    }
  }
  Query::Query(this,in_RDI);
  return this;
}

Assistant:

Query flatten_trivial_operations(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::AND && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    if (q.get_type() == QueryType::OR && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    return std::move(q);
}